

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool calculateSimilartyMap<short>
               (int32_t keyPressWidth_samples,int32_t alignWindow_samples,
               int32_t offsetFromPeak_samples,TKeyPressCollectionT<short> *keyPresses,
               TSimilarityMap *res)

{
  pointer pvVar1;
  TSimilarityMap *__range1;
  vector<stMatch,_std::allocator<stMatch>_> *x;
  pointer this;
  iterator __begin1;
  pointer ptVar2;
  int iVar3;
  int local_a0;
  int nWorkers;
  int a;
  int w;
  int nPresses;
  int32_t offsetFromPeak_samples_local;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  type local_70;
  thread local_38;
  
  iVar3 = (int)(((long)(keyPresses->
                       super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                       .
                       super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(keyPresses->
                      super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  a = alignWindow_samples;
  w = keyPressWidth_samples;
  nPresses = iVar3;
  offsetFromPeak_samples_local = offsetFromPeak_samples;
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::clear(res);
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::resize(res,(long)iVar3);
  pvVar1 = (res->
           super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (this = (res->
              super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; this != pvVar1; this = this + 1) {
    std::vector<stMatch,_std::allocator<stMatch>_>::resize(this,(long)iVar3);
  }
  nWorkers = std::thread::hardware_concurrency();
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&workers,(long)nWorkers,(allocator_type *)&local_70);
  iVar3 = 0;
  while( true ) {
    ptVar2 = workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a0 = iVar3;
    if ((int)((ulong)((long)workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3) <= iVar3) break;
    local_70.nPresses = &nPresses;
    local_70.nWorkers = &nWorkers;
    local_70.offsetFromPeak_samples = &offsetFromPeak_samples_local;
    local_70.w = &w;
    local_70.a = &a;
    local_70.res = res;
    local_70.keyPresses = keyPresses;
    std::thread::
    thread<calculateSimilartyMap<short>(int,int,int,stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::_lambda(int)_1_,int&,void>
              (&local_38,&local_70,&local_a0);
    std::thread::operator=(ptVar2 + iVar3,&local_38);
    std::thread::~thread(&local_38);
    iVar3 = local_a0 + 1;
  }
  for (; ptVar2 != workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&workers);
  return true;
}

Assistant:

bool calculateSimilartyMap(
        const int32_t keyPressWidth_samples,
        const int32_t alignWindow_samples,
        const int32_t offsetFromPeak_samples,
        TKeyPressCollectionT<T> & keyPresses,
        TSimilarityMap & res) {
    int nPresses = keyPresses.size();

    int w = keyPressWidth_samples;
    int a = alignWindow_samples;

    res.clear();
    res.resize(nPresses);
    for (auto & x : res) x.resize(nPresses);

#ifdef __EMSCRIPTEN__
    int nWorkers = std::min(kMaxThreads, std::max(1, int(std::thread::hardware_concurrency()) - 2));
#else
    int nWorkers = std::thread::hardware_concurrency();
#endif

    std::vector<std::thread> workers(nWorkers);
    for (int iw = 0; iw < (int) workers.size(); ++iw) {
        auto & worker = workers[iw];
        worker = std::thread([&](int ith) {
            for (int i = ith; i < nPresses; i += nWorkers) {
                res[i][i].cc = 1.0f;
                res[i][i].offset = 0;

                const auto & waveform0 = keyPresses[i].waveform;
                const auto & pos0      = keyPresses[i].pos;

                auto & avgcc = keyPresses[i].ccAvg;

                const auto samples0 = waveform0.samples;

                for (int j = i + 1; j < nPresses; ++j) {
                    if (i == j) continue;

                    const auto waveform1 = keyPresses[j].waveform;
                    const auto pos1      = keyPresses[j].pos;

                    const auto samples1 = waveform1.samples;
                    const auto ret = findBestCC(TWaveformViewT<T> { samples0 + pos0 + offsetFromPeak_samples - w,     2*w },
                                                TWaveformViewT<T> { samples1 + pos1 + offsetFromPeak_samples - w - a, 2*w + 2*a }, a);

                    const auto bestcc     = std::get<0>(ret);
                    const auto bestoffset = std::get<1>(ret);

                    res[i][j].cc = bestcc;
                    res[i][j].offset = bestoffset;

                    res[j][i].cc = bestcc;
                    res[j][i].offset = -bestoffset;

                    avgcc += bestcc;
                }
                avgcc /= (nPresses - 1);
            }
        }, iw);
    }

    for (auto & worker : workers) worker.join();

    return true;
}